

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O2

ChMatrixNM<double,_6,_6> * __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint
          (ChMatrixNM<double,_6,_6> *__return_storage_ptr__,
          ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this,double eta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  DampingCoefficients rdamping_coeff_B;
  DampingCoefficients rdamping_coeff_A;
  ChMatrixNM<double,_6,_6> Klaw_point;
  ChMatrixNM<double,_6,_6> mb;
  Matrix<double,_6,_6,_1,_6,_6> *local_308;
  ChMatrixNM<double,_6,_6> *local_300;
  Matrix<double,_6,_6,_1,_6,_6> *local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ChMatrixNM<double,_6,_6> local_2a0;
  Matrix<double,_6,_6,_1,_6,_6> local_180;
  
  (**(code **)(*(long *)(this->section_fpmA).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x150))(&local_2c8);
  (**(code **)(*(long *)(this->section_fpmB).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x150))(&local_2f0);
  uVar8 = (**(code **)(*(long *)(this->section_fpmA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x1a8))();
  dVar9 = (double)(**(code **)(*(long *)(this->section_fpmB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x1a8))();
  dVar6 = (eta + 1.0) * 0.5;
  dVar7 = (1.0 - eta) * 0.5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_2c8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6 * local_2f0;
  auVar1 = vfmadd231sd_fma(auVar15,auVar11,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_2c0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar6 * local_2e8;
  auVar2 = vfmadd231sd_fma(auVar13,auVar11,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar6 * dVar9;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7;
  auVar3 = vfmadd231sd_fma(auVar10,auVar12,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_2b8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6 * local_2e0;
  auVar4 = vfmadd231sd_fma(auVar16,auVar12,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_2b0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar6 * local_2d8;
  auVar5 = vfmadd231sd_fma(auVar14,auVar12,auVar5);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_180);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[7] =
       auVar3._0_8_ * auVar2._0_8_;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xe]
       = auVar3._0_8_ * auVar4._0_8_;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       auVar1._0_8_;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x15] = auVar5._0_8_;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1c] = auVar4._0_8_;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = auVar2._0_8_;
  GetKlawAtPoint(&local_2a0,this,eta);
  local_308 = &local_180;
  local_300 = &local_2a0;
  local_2f8 = &local_180;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,6,1,6,6>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,6,1,6,6>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>_>
              *)&local_308);
  return __return_storage_ptr__;
}

Assistant:

ChMatrixNM<double, 6, 6> ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint(const double eta) {
    DampingCoefficients rdamping_coeff_A = this->section_fpmA->GetBeamRaleyghDamping();
    DampingCoefficients rdamping_coeff_B = this->section_fpmB->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping_A = this->section_fpmA->GetArtificialFactorForShearDamping();
    double artificial_factor_for_shear_damping_B = this->section_fpmB->GetArtificialFactorForShearDamping();

    // linear interpolation
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double mbx = Nx1 * rdamping_coeff_A.bx + Nx2 * rdamping_coeff_B.bx;
    double mby = Nx1 * rdamping_coeff_A.by + Nx2 * rdamping_coeff_B.by;
    double mbz = Nx1 * rdamping_coeff_A.bz + Nx2 * rdamping_coeff_B.bz;
    double mbt = Nx1 * rdamping_coeff_A.bt + Nx2 * rdamping_coeff_B.bt;
    double artificial_factor_for_shear_damping =
        Nx1 * artificial_factor_for_shear_damping_A + Nx2 * artificial_factor_for_shear_damping_B;

    ChMatrixNM<double, 6, 6> mb;
    mb.setIdentity();
    mb(0, 0) = mbx;
    mb(1, 1) = mby * artificial_factor_for_shear_damping;
    mb(2, 2) = mbz * artificial_factor_for_shear_damping;
    mb(3, 3) = mbt;
    mb(4, 4) = mbz;
    mb(5, 5) = mby;

    ChMatrixNM<double, 6, 6> Klaw_point = this->GetKlawAtPoint(eta);
    ChMatrixNM<double, 6, 6> Rlaw_point = mb.transpose() * Klaw_point * mb;  // material damping matrix

    return Rlaw_point;
}